

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2WithImpl::getDecomposition
          (Normalizer2WithImpl *this,UChar32 c,UnicodeString *decomposition)

{
  UBool UVar1;
  int32_t length;
  UChar buffer [4];
  int32_t local_34;
  ConstChar16Ptr local_30 [3];
  UChar local_18 [4];
  
  local_30[0].p_ = Normalizer2Impl::getDecomposition(this->impl,c,local_18,&local_34);
  if (local_30[0].p_ == (UChar *)0x0) {
    UVar1 = '\0';
  }
  else {
    if (local_30[0].p_ == local_18) {
      UnicodeString::setTo(decomposition,local_18,local_34);
    }
    else {
      UnicodeString::setTo(decomposition,'\0',local_30,local_34);
    }
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

virtual UBool
    getDecomposition(UChar32 c, UnicodeString &decomposition) const {
        UChar buffer[4];
        int32_t length;
        const UChar *d=impl.getDecomposition(c, buffer, length);
        if(d==NULL) {
            return FALSE;
        }
        if(d==buffer) {
            decomposition.setTo(buffer, length);  // copy the string (Jamos from Hangul syllable c)
        } else {
            decomposition.setTo(FALSE, d, length);  // read-only alias
        }
        return TRUE;
    }